

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFlow.c
# Opt level: O0

int Nwk_ManPushForwardBot_rec(Nwk_Obj_t *pObj,Nwk_Obj_t *pPred)

{
  int iVar1;
  Nwk_Obj_t *pNVar2;
  Nwk_Obj_t *pPred_00;
  bool bVar3;
  int local_2c;
  Nwk_Obj_t *pNStack_28;
  int i;
  Nwk_Obj_t *pNext;
  Nwk_Obj_t *pPred_local;
  Nwk_Obj_t *pObj_local;
  
  iVar1 = Nwk_ObjVisitedBot(pObj);
  if (iVar1 == 0) {
    Nwk_ObjSetVisitedBot(pObj);
    iVar1 = Nwk_ObjHasFlow(pObj);
    if (iVar1 == 0) {
      iVar1 = Nwk_ManPushForwardTop_rec(pObj,pObj);
      if (iVar1 != 0) {
        Nwk_ObjSetFlow(pObj);
        iVar1 = Nwk_ObjSetPred(pObj,pPred);
        return iVar1;
      }
    }
    else {
      pNVar2 = Nwk_ObjPred(pObj);
      if (pNVar2 != (Nwk_Obj_t *)0x0) {
        pNVar2 = Nwk_ObjPred(pObj);
        pPred_00 = Nwk_ObjPred(pObj);
        iVar1 = Nwk_ManPushForwardTop_rec(pNVar2,pPred_00);
        if (iVar1 != 0) {
          iVar1 = Nwk_ObjSetPred(pObj,pPred);
          return iVar1;
        }
      }
    }
    local_2c = 0;
    while( true ) {
      bVar3 = false;
      if (local_2c < pObj->nFanins) {
        pNStack_28 = pObj->pFanio[local_2c];
        bVar3 = pNStack_28 != (Nwk_Obj_t *)0x0;
      }
      if (!bVar3) {
        return 0;
      }
      iVar1 = Nwk_ManPushForwardBot_rec(pNStack_28,pPred);
      if (iVar1 != 0) break;
      local_2c = local_2c + 1;
    }
    pObj_local._4_4_ = 1;
  }
  else {
    pObj_local._4_4_ = 0;
  }
  return pObj_local._4_4_;
}

Assistant:

int Nwk_ManPushForwardBot_rec( Nwk_Obj_t * pObj, Nwk_Obj_t * pPred )
{
    Nwk_Obj_t * pNext;
    int i;
    if ( Nwk_ObjVisitedBot(pObj) )
        return 0;
    Nwk_ObjSetVisitedBot(pObj);
    // propagate through the internal edge
    if ( Nwk_ObjHasFlow(pObj) )
    {
        if ( Nwk_ObjPred(pObj) )
            if ( Nwk_ManPushForwardTop_rec( Nwk_ObjPred(pObj), Nwk_ObjPred(pObj) ) )
                return Nwk_ObjSetPred( pObj, pPred ); 
    }
    else if ( Nwk_ManPushForwardTop_rec(pObj, pObj) )
    {
        Nwk_ObjSetFlow( pObj );
        return Nwk_ObjSetPred( pObj, pPred );
    }
    // try to push through the fanins
    Nwk_ObjForEachFanin( pObj, pNext, i )
        if ( Nwk_ManPushForwardBot_rec( pNext, pPred ) )
            return 1;
    return 0;
}